

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O2

Result __thiscall
tonk::SessionOutgoing::QueueReliable
          (SessionOutgoing *this,uint messageType,uint8_t *data,size_t bytes)

{
  _func_int **pp_Var1;
  size_t sVar2;
  Result *success;
  undefined4 in_register_00000034;
  long lVar3;
  ulong in_R8;
  long lVar4;
  bool bVar5;
  Locker locker;
  string local_50;
  
  lVar3 = CONCAT44(in_register_00000034,messageType);
  if (in_R8 < 0xfa01) {
    locker.TheLock = (Lock *)(lVar3 + 0x238);
    std::recursive_mutex::lock((recursive_mutex *)locker.TheLock);
    lVar4 = lVar3 + 0x78;
    if ((uint)data < 0x12) {
      lVar4 = lVar3 + 0x50;
    }
    while( true ) {
      sVar2 = OutgoingQueue::AppendSplitReliable
                        ((OutgoingQueue *)(lVar4 + 0x318),(uint)data,(uint8_t *)bytes,in_R8);
      bVar5 = in_R8 < sVar2;
      in_R8 = in_R8 - sVar2;
      if (bVar5 || in_R8 == 0) break;
      OutgoingQueue::PushAndGetFreshBuffer((OutgoingQueue *)this);
      if ((this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing != (_func_int **)0x0)
      goto LAB_00125afd;
      bytes = bytes + sVar2;
      Result::~Result((Result *)this);
    }
    (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = (_func_int **)0x0;
LAB_00125afd:
    Locker::~Locker(&locker);
  }
  else {
    std::__cxx11::to_string(&local_50,in_R8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&locker,
                   &local_50," byte message too large");
    pp_Var1 = (_func_int **)operator_new(0x38);
    *pp_Var1 = (_func_int *)"SessionOutgoing::QueueReliableMessage";
    std::__cxx11::string::string((string *)(pp_Var1 + 1),(string *)&locker);
    *(undefined4 *)(pp_Var1 + 5) = 0;
    pp_Var1[6] = (_func_int *)0x5;
    (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = pp_Var1;
    std::__cxx11::string::~string((string *)&locker);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return (Result)(ErrorResult *)this;
}

Assistant:

Result SessionOutgoing::QueueReliable(
    unsigned messageType,
    const uint8_t* data,
    size_t bytes)
{
    // Note: Compressed type is generated internally by Flush()
    TONK_DEBUG_ASSERT(messageType > protocol::MessageType_Compressed);
    // Control/Unordered must be queued via QueueControl()/QueueUnordered()
    TONK_DEBUG_ASSERT(messageType < protocol::MessageType_Control);

    // WARNING: This function is not called on the Connection green thread,
    // so accessing members here is not threadsafe by default.

    // Check for oversized messages without any additions up front to avoid
    // integer overflow issues
    if (bytes > TONK_MAX_RELIABLE_BYTES)
    {
        return Result("SessionOutgoing::QueueReliableMessage",
            std::to_string(bytes) + " byte message too large",
            ErrorType::Tonk,
            Tonk_MessageTooLarge);
    }

    const unsigned queueIndex = (messageType >= protocol::MessageType_LowPri)
        ? Queue_LowPri : Queue_Reliable;

    Locker locker(OutgoingQueueLock);

    OutgoingQueue* queue = &Queues[queueIndex];

    for (;;)
    {
        // Attempt to append message to OutBuffer
        const size_t written = queue->AppendSplitReliable(messageType, data, bytes);
        TONK_DEBUG_ASSERT(written <= bytes);
        if (written >= bytes) {
            break; // Done
        }

        data += written, bytes -= written;

        // Push the OutBuffer to the send queue and start a new OutBuffer
        const Result result = queue->PushAndGetFreshBuffer();
        if (result.IsFail()) {
            TONK_DEBUG_BREAK();
            return result;
        }
    }

    return Result::Success();
}